

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O2

string * __thiscall
Test::Suite::toPrettyTypeName_abi_cxx11_(string *__return_storage_ptr__,Suite *this,type_info *type)

{
  char *pcVar1;
  unique_ptr<char,_void_(*)(void_*)> owner;
  unique_ptr<char,_void_(*)(void_*)> local_20;
  
  pcVar1 = (this->suiteName)._M_dataplus._M_p;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,pcVar1 + (*pcVar1 == '*'),(allocator<char> *)&local_20
            );
  pcVar1 = (this->suiteName)._M_dataplus._M_p;
  local_20._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>._M_head_impl
       = (char *)__cxa_demangle(pcVar1 + (*pcVar1 == '*'),0,0,0);
  local_20._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)free;
  pcVar1 = local_20._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
           _M_head_impl;
  if (local_20._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
      _M_head_impl == (char *)0x0) {
    pcVar1 = (this->suiteName)._M_dataplus._M_p;
    pcVar1 = pcVar1 + (*pcVar1 == '*');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (__return_storage_ptr__,pcVar1);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string Suite::toPrettyTypeName(const std::type_info &type) {
  // Adapted from Howard Hinnants's implementation in http://stackoverflow.com/a/18369732
  std::string result = type.name();
#if defined(__GNUG__) || defined(__clang__)
  std::unique_ptr<char, void (*)(void *)> owner{abi::__cxa_demangle(type.name(), nullptr, nullptr, nullptr), std::free};
  result = owner ? owner.get() : type.name();
#endif
  return result;
}